

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
equalize_histogram(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
                  vector<int,_std::allocator<int>_> *iterations_histogram,int max_iterations)

{
  int iVar1;
  size_type sVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  iterator __result;
  reference pvVar5;
  reference piVar6;
  iterator __result_00;
  float fVar7;
  anon_class_16_2_8ac4cebb __unary_op;
  allocator<float> local_96;
  undefined1 local_95;
  float local_94;
  int local_90;
  float f;
  value_type total_iterations;
  int *local_80;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> cdf_min;
  allocator<int> local_39;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> cdf;
  int max_iterations_local;
  vector<int,_std::allocator<int>_> *iterations_histogram_local;
  vector<float,_std::allocator<float>_> *equalized_iterations;
  
  cdf.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = max_iterations;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(iterations_histogram);
  std::allocator<int>::allocator(&local_39);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,sVar2,&local_39);
  std::allocator<int>::~allocator(&local_39);
  cVar3 = std::vector<int,_std::allocator<int>_>::cbegin(iterations_histogram);
  cVar4 = std::vector<int,_std::allocator<int>_>::cend(iterations_histogram);
  __result = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_38);
  cdf_min._M_current =
       (int *)std::
              partial_sum<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                        (cVar3._M_current,cVar4._M_current,__result._M_current);
  local_80 = (int *)std::vector<int,_std::allocator<int>_>::cbegin
                              ((vector<int,_std::allocator<int>_> *)local_38);
  _total_iterations =
       std::vector<int,_std::allocator<int>_>::cend((vector<int,_std::allocator<int>_> *)local_38);
  local_78 = std::
             find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,equalize_histogram(std::vector<int,std::allocator<int>>const&,int)::__0>
                       (local_80,_total_iterations);
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_38);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_38,sVar2 - 1);
  iVar1 = *pvVar5;
  fVar7 = (float)cdf.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage._4_4_;
  local_90 = iVar1;
  piVar6 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&local_78);
  local_94 = fVar7 / (float)(iVar1 - *piVar6);
  local_95 = 0;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(iterations_histogram);
  std::allocator<float>::allocator(&local_96);
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,sVar2,&local_96);
  std::allocator<float>::~allocator(&local_96);
  cVar3 = std::vector<int,_std::allocator<int>_>::cbegin
                    ((vector<int,_std::allocator<int>_> *)local_38);
  cVar4 = std::vector<int,_std::allocator<int>_>::cend
                    ((vector<int,_std::allocator<int>_> *)local_38);
  __result_00 = std::vector<float,_std::allocator<float>_>::begin(__return_storage_ptr__);
  __unary_op._4_4_ = 0;
  __unary_op.f = local_94;
  __unary_op.cdf_min._M_current = local_78._M_current;
  std::
  transform<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,equalize_histogram(std::vector<int,std::allocator<int>>const&,int)::__1>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             cVar3._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             cVar4._M_current,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             __result_00._M_current,__unary_op);
  local_95 = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> equalize_histogram(const std::vector<int>& iterations_histogram, const int max_iterations)
{
    // Calculate the CDF (Cumulative Distribution Function) by accumulating all iteration counts.
    // Element [0] is unused and iterations_histogram[max_iterations] should be zero (as we do not count
    // the iterations of the points inside the Mandelbrot Set).
    std::vector<int> cdf(iterations_histogram.size());
    std::partial_sum(iterations_histogram.cbegin(), iterations_histogram.cend(), cdf.begin());

    // Get the minimum value in the CDF that is bigger than zero and the sum of all iteration counts
    // from iterations_histogram (which is the last value of the CDF).
    const auto cdf_min = std::find_if(cdf.cbegin(), cdf.cend(), [](auto n) { return n > 0; });
    const auto total_iterations = cdf[cdf.size() - 1];

    // normalize all values from the CDF that are bigger than zero to a range of 0.0 .. max_iterations
    const auto f = static_cast<float>(max_iterations) / static_cast<float>(total_iterations - *cdf_min);
    std::vector<float> equalized_iterations(iterations_histogram.size());
    std::transform(cdf.cbegin(), cdf.cend(), equalized_iterations.begin(),
                   [=](const auto& c) { return c > 0 ? f * static_cast<float>(c - *cdf_min) : 0.0f; });

    return equalized_iterations;
}